

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

Vec_Ptr_t * Aig_ManVecRandSubset(Vec_Ptr_t *vVec,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  void *Entry;
  uint Rand;
  void *pEntry;
  Vec_Ptr_t *vRes;
  int nVars_local;
  Vec_Ptr_t *vVec_local;
  
  p = Vec_PtrDup(vVec);
  while( true ) {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= nVars) break;
    uVar2 = Aig_ManRandom(0);
    uVar3 = Vec_PtrSize(p);
    Entry = Vec_PtrEntry(p,uVar2 % uVar3);
    Vec_PtrRemove(p,Entry);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Aig_ManVecRandSubset( Vec_Ptr_t * vVec, int nVars )
{
    Vec_Ptr_t * vRes;
    void * pEntry;
    unsigned Rand; 
    vRes = Vec_PtrDup(vVec);
    while ( Vec_PtrSize(vRes) > nVars )
    {
        Rand   = Aig_ManRandom( 0 );
        pEntry = Vec_PtrEntry( vRes, Rand % Vec_PtrSize(vRes) );
        Vec_PtrRemove( vRes, pEntry );
    }
    return vRes;
}